

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

int64_t util::parse(char *s)

{
  char cVar1;
  char cVar2;
  overflow_error *this;
  long lVar3;
  invalid_argument *this_00;
  size_t sVar4;
  long lVar5;
  code *pcVar6;
  undefined *puVar7;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((s == (char *)0x0) || (cVar1 = *s, cVar1 == '\0')) {
    this = (overflow_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this,"null or empty string argument");
    puVar7 = &std::invalid_argument::typeinfo;
    pcVar6 = std::invalid_argument::~invalid_argument;
LAB_001051b0:
    __cxa_throw(this,puVar7,pcVar6);
  }
  __s = s + ((cVar1 - 0x2bU & 0xfd) == 0);
  cVar2 = *__s;
  if (cVar2 == '\0') {
    lVar3 = 0;
  }
  else {
    lVar5 = 0;
    do {
      if ((byte)(cVar2 - 0x3aU) < 0xf6) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"invalid input string","");
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        sVar4 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar4);
        std::operator+(&local_48,&local_88,&local_68);
        std::invalid_argument::invalid_argument(this_00,(string *)&local_48);
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      lVar5 = (lVar5 * 10 - (long)cVar2) + 0x30;
      if (0 < lVar5) {
        this = (overflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error(this,"overflow occured when parsing");
        goto LAB_001051a2;
      }
      cVar2 = __s[1];
      __s = __s + 1;
    } while (cVar2 != '\0');
    lVar3 = -lVar5;
    if (cVar1 == '-') {
      lVar3 = lVar5;
    }
    if (lVar3 < 0 != (cVar1 == '-') && lVar5 != 0) {
      this = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(this,"overflow occured when parsing");
LAB_001051a2:
      puVar7 = &std::overflow_error::typeinfo;
      pcVar6 = std::overflow_error::~overflow_error;
      goto LAB_001051b0;
    }
  }
  return lVar3;
}

Assistant:

std::int64_t parse(const char* s)
{
	if (s == nullptr || *s == '\0')
		throw std::invalid_argument("null or empty string argument");

	bool negative = (s[0] == '-');
	if (*s == '+' || *s == '-')
		++s;

	std::int64_t ret = 0;
	while (*s)
	{
		ret = ret * 10 - (*s - '0'); // assume negative since |min| >= |max|

		if (*s < '0' || *s > '9')
			throw std::invalid_argument(std::string("invalid input string") + std::string(s));

		if (ret > 0)
			throw std::overflow_error("overflow occured when parsing");

		++s;
	}
	ret = negative ? ret : -ret;
	if (negative != (ret < 0) && ret != 0)
		throw std::overflow_error("overflow occured when parsing");

	return ret;
}